

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void regenerateBuffer(void)

{
  code *pcVar1;
  reference v;
  reference pvVar2;
  long lVar3;
  float *pfVar4;
  float fVar5;
  undefined1 local_1c [8];
  vec3 pos;
  int n;
  Perf stat;
  
  Perf::Perf((Perf *)((long)&pos.field_0 + 0xb),"Regenerate legendre buffer");
  std::vector<float,_std::allocator<float>_>::resize(&shape_scalars,vertex_count);
  for (pos.field_0.field_0.y = 0.0; (ulong)(long)(int)pos.field_0.field_0.y < vertex_count;
      pos.field_0.field_0.y = (value_type)((int)pos.field_0.field_0.y + 1)) {
    v = std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::
        operator[](&sphere_positions,(long)(int)pos.field_0.field_0.y);
    glm::detail::tvec3<float>::tvec3((tvec3<float> *)local_1c,v);
    fVar5 = legendre_total((vec3 *)local_1c,legendre_params);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&shape_scalars,(long)(int)pos.field_0.field_0.y);
    *pvVar2 = fVar5;
  }
  (*__glewBindBuffer)(0x8892,vertex_buffer);
  pcVar1 = __glewBufferData;
  lVar3 = vertex_count << 2;
  pfVar4 = std::vector<float,_std::allocator<float>_>::data(&shape_scalars);
  (*pcVar1)(0x8892,lVar3,pfVar4,0x88e8);
  return;
}

Assistant:

void regenerateBuffer() {
    Perf stat("Regenerate legendre buffer");
    shape_scalars.resize(vertex_count);
    for (int n = 0; n < vertex_count; n++) {
        vec3 pos = sphere_positions[n];
        shape_scalars[n] = legendre_total(pos, legendre_params);
    }

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, vertex_count * sizeof(float), shape_scalars.data(), GL_DYNAMIC_DRAW);
}